

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_data.cpp
# Opt level: O0

Timestamp ot::commissioner::Timestamp::Cur(void)

{
  rep rVar1;
  duration<long,_std::ratio<1L,_1000000L>_> local_20 [2];
  rep now;
  Timestamp cur;
  
  local_20[0] = NowSinceEpoch<std::chrono::duration<long,std::ratio<1l,1000000l>>>();
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(local_20);
  return (Timestamp)
         (rVar1 / 1000000 & 0xffffffffffffU | ((rVar1 % 1000000 << 0xf) / 1000000 & 0x7fffU) << 0x30
         );
}

Assistant:

Timestamp Timestamp::Cur()
{
    Timestamp cur;
    auto      now = NowSinceEpoch<std::chrono::microseconds>().count();
    cur.mSeconds  = now / 1000000;
    cur.mTicks    = (now % 1000000) * (1 << 15) / 1000000;

    // Not an authoritive source
    cur.mU = 0;

    return cur;
}